

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O3

void * xmlListReverseSearch(xmlListPtr l,void *data)

{
  xmlLinkPtr pxVar1;
  void *pvVar2;
  
  if (l != (xmlListPtr)0x0) {
    pxVar1 = xmlListLinkReverseSearch(l,data);
    if (pxVar1 == (xmlLinkPtr)0x0) {
      pvVar2 = (void *)0x0;
    }
    else {
      pvVar2 = pxVar1->data;
    }
    return pvVar2;
  }
  return (void *)0x0;
}

Assistant:

void *
xmlListReverseSearch(xmlListPtr l, void *data)
{
    xmlLinkPtr lk;
    if (l == NULL)
        return(NULL);
    lk = xmlListLinkReverseSearch(l, data);
    if (lk)
        return (lk->data);
    return NULL;
}